

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O0

void __thiscall imrt::ACO::~ACO(ACO *this)

{
  code *pcVar1;
  ACO *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~ACO() {
    for (int i=0; i < n_ants; i++) {
       delete ants[i];
    }
  }